

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framework.h
# Opt level: O0

void __thiscall hedg::Framework::initialize(Framework *this)

{
  int nThreads;
  Publisher *pPVar1;
  vector<std::thread,_std::allocator<std::thread>_> *this_00;
  Market_Handler local_208;
  undefined1 local_b0 [32];
  reference_wrapper<boost::asio::ssl::context> local_90;
  reference_wrapper<boost::asio::io_context> local_88;
  Publisher *local_80;
  code *local_78;
  size_type local_70;
  reference_wrapper<boost::asio::ssl::context> local_68;
  reference_wrapper<boost::asio::io_context> local_60;
  Publisher *local_58;
  code *local_50;
  __node_base_ptr local_48;
  Publisher *local_40;
  code *local_38;
  __node_base local_30;
  MarketGenerator *local_28;
  code *local_20;
  size_t local_18;
  Framework *local_10;
  Framework *this_local;
  
  this_00 = &this->threads;
  local_20 = MarketGenerator::generate;
  local_18 = 0;
  local_28 = &this->gen;
  local_10 = this;
  std::vector<std::thread,std::allocator<std::thread>>::
  emplace_back<void(hedg::MarketGenerator::*)(),hedg::MarketGenerator*>
            ((vector<std::thread,std::allocator<std::thread>> *)this_00,(type *)&local_20,&local_28)
  ;
  local_38 = Publisher::run;
  local_30._M_nxt = (_Hash_node_base *)0x0;
  pPVar1 = &this->pub;
  local_40 = pPVar1;
  std::vector<std::thread,std::allocator<std::thread>>::
  emplace_back<void(hedg::Publisher::*)(),hedg::Publisher*>
            ((vector<std::thread,std::allocator<std::thread>> *)this_00,(type *)&local_38,&local_40)
  ;
  local_50 = Publisher::order_subscribe;
  local_48 = (__node_base_ptr)0x0;
  local_58 = pPVar1;
  local_60 = std::ref<boost::asio::io_context>(&this->service);
  local_68 = std::ref<boost::asio::ssl::context>(&this->context);
  std::vector<std::thread,std::allocator<std::thread>>::
  emplace_back<void(hedg::Publisher::*)(boost::asio::io_context&,boost::asio::ssl::context&),hedg::Publisher*,std::reference_wrapper<boost::asio::io_context>,std::reference_wrapper<boost::asio::ssl::context>>
            ((vector<std::thread,std::allocator<std::thread>> *)this_00,(type *)&local_50,&local_58,
             &local_60,&local_68);
  local_78 = Publisher::clean_up_markets;
  local_70 = 0;
  local_80 = pPVar1;
  local_88 = std::ref<boost::asio::io_context>(&this->service);
  local_90 = std::ref<boost::asio::ssl::context>(&this->context);
  std::vector<std::thread,std::allocator<std::thread>>::
  emplace_back<void(hedg::Publisher::*)(boost::asio::io_context&,boost::asio::ssl::context&),hedg::Publisher*,std::reference_wrapper<boost::asio::io_context>,std::reference_wrapper<boost::asio::ssl::context>>
            ((vector<std::thread,std::allocator<std::thread>> *)this_00,(type *)&local_78,&local_80,
             &local_88,&local_90);
  local_b0._16_8_ = Publisher::get_data;
  local_b0._24_8_ = 0;
  local_b0._8_8_ = pPVar1;
  std::vector<std::thread,std::allocator<std::thread>>::
  emplace_back<void(hedg::Publisher::*)(),hedg::Publisher*>
            ((vector<std::thread,std::allocator<std::thread>> *)this_00,(type *)(local_b0 + 0x10),
             (Publisher **)(local_b0 + 8));
  Market_Handler::Market_Handler(&local_208,&this->markets);
  std::make_unique<hedg::Market_Handler,hedg::Market_Handler>((Market_Handler *)local_b0);
  std::unique_ptr<hedg::Market_Handler,_std::default_delete<hedg::Market_Handler>_>::operator=
            (&this->handler,
             (unique_ptr<hedg::Market_Handler,_std::default_delete<hedg::Market_Handler>_> *)
             local_b0);
  std::unique_ptr<hedg::Market_Handler,_std::default_delete<hedg::Market_Handler>_>::~unique_ptr
            ((unique_ptr<hedg::Market_Handler,_std::default_delete<hedg::Market_Handler>_> *)
             local_b0);
  Market_Handler::~Market_Handler(&local_208);
  nThreads = std::thread::hardware_concurrency();
  ctpl::thread_pool::resize(&this->t_pool,nThreads);
  this->initialized = true;
  return;
}

Assistant:

void initialize() {
		threads.emplace_back(&MarketGenerator::generate, &gen);
		threads.emplace_back(&Publisher::run, &pub);
		threads.emplace_back(&Publisher::order_subscribe, &pub, std::ref(service), std::ref(context));
		threads.emplace_back(&Publisher::clean_up_markets, &pub, std::ref(service), std::ref(context));
		threads.emplace_back(&Publisher::get_data, &pub);
		handler = std::make_unique<Market_Handler>(Market_Handler(markets));
		t_pool.resize(std::thread::hardware_concurrency());
		initialized = true;

	}